

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall anon_unknown.dwarf_52dd::TlbExportVisitor::visit_(TlbExportVisitor *this,Enum *type)

{
  string *current;
  long lVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  Type *type_00;
  Indent indenter;
  Indent local_78;
  string local_50;
  
  lVar1 = Typelib::Enum::values_abi_cxx11_();
  poVar2 = std::operator<<(this->m_stream,"<enum name=\"");
  Typelib::Type::getName_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,(string *)&local_78);
  poVar2 = std::operator<<(poVar2,"\" ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(&local_50,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  std::operator<<(poVar2,">\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_78);
  current = &this->m_indent;
  Indent::Indent(&local_78,current);
  for (p_Var3 = *(_Rb_tree_node_base **)(lVar1 + 0x18); p_Var3 != (_Rb_tree_node_base *)(lVar1 + 8);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::operator<<(this->m_stream,(string *)current);
    poVar2 = std::operator<<(poVar2,"<value symbol=\"");
    poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
    poVar2 = std::operator<<(poVar2,"\" value=\"");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,p_Var3[2]._M_color);
    std::operator<<(poVar2,"\"/>\n");
  }
  Indent::~Indent(&local_78);
  poVar2 = std::operator<<(this->m_stream,(string *)current);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_((string *)&local_78,type,type_00)
  ;
  poVar2 = std::operator<<(poVar2,(string *)&local_78);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_78);
  poVar2 = std::operator<<(this->m_stream,(string *)current);
  std::operator<<(poVar2,"</enum>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_ (Enum const& type)
    {
        Enum::ValueMap const& values = type.values();
        m_stream << "<enum name=\"" << type.getName() << "\" " << emitSourceID() << ">\n";
        { Indent indenter(m_indent);
            Enum::ValueMap::const_iterator it;
            for (it = values.begin(); it != values.end(); ++it)
                m_stream << m_indent << "<value symbol=\"" << it->first << "\" value=\"" << it->second << "\"/>\n";
        }
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</enum>";

        return true;
    }